

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O1

uint8_t char_bit_count(uint8_t i,uint8_t length)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,i);
  if (uVar1 == 0) {
    length = '\0';
  }
  else if (length != '\0') {
    if (length != '\b') {
      uVar1 = (uint)(i & ""[length]);
    }
    length = ""[uVar1 & 0xff];
  }
  return length;
}

Assistant:

uint8_t char_bit_count(uint8_t i, uint8_t length) {
    //if i == 0 return 0
    if (i == 0) {
        return 0;
    }

    //cut bitmask counter
    switch (length) {
        case 8:
            break;
        case 0:
            return 0;
        default:
            i &= precount_mask[length]; //replacement for bitmask count (2 << counter - 1) - 1
    }

    return precount[i];
}